

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O0

mmap_context *
mio::detail::memory_map
          (mmap_context *__return_storage_ptr__,file_handle_type file_handle,int64_t offset,
          int64_t length,access_mode mode,error_code *error)

{
  size_t __offset;
  size_t __len;
  void *pvVar1;
  int __prot;
  error_code eVar2;
  undefined4 uStack_54;
  char *mapping_start;
  int64_t length_to_map;
  int64_t aligned_offset;
  error_code *error_local;
  access_mode mode_local;
  int64_t length_local;
  int64_t offset_local;
  file_handle_type file_handle_local;
  
  __offset = make_offset_page_aligned(offset);
  __len = (offset - __offset) + length;
  __prot = 2;
  if (mode == read) {
    __prot = 1;
  }
  pvVar1 = mmap((void *)0x0,__len,__prot,1,file_handle,__offset);
  if (pvVar1 == (void *)0xffffffffffffffff) {
    eVar2 = last_error();
    *(ulong *)error = CONCAT44(uStack_54,eVar2._M_value);
    error->_M_cat = eVar2._M_cat;
    memset(__return_storage_ptr__,0,0x18);
  }
  else {
    __return_storage_ptr__->data = (char *)((long)pvVar1 + (offset - __offset));
    __return_storage_ptr__->length = length;
    __return_storage_ptr__->mapped_length = __len;
  }
  return __return_storage_ptr__;
}

Assistant:

inline mmap_context memory_map(const file_handle_type file_handle, const int64_t offset,
    const int64_t length, const access_mode mode, std::error_code& error)
{
    const int64_t aligned_offset = make_offset_page_aligned(offset);
    const int64_t length_to_map = offset - aligned_offset + length;
#ifdef _WIN32
    const int64_t max_file_size = offset + length;
    const auto file_mapping_handle = ::CreateFileMapping(
            file_handle,
            0,
            mode == access_mode::read ? PAGE_READONLY : PAGE_READWRITE,
            win::int64_high(max_file_size),
            win::int64_low(max_file_size),
            0);
    if(file_mapping_handle == invalid_handle)
    {
        error = detail::last_error();
        return {};
    }
    char* mapping_start = static_cast<char*>(::MapViewOfFile(
            file_mapping_handle,
            mode == access_mode::read ? FILE_MAP_READ : FILE_MAP_WRITE,
            win::int64_high(aligned_offset),
            win::int64_low(aligned_offset),
            length_to_map));
    if(mapping_start == nullptr)
    {
        // Close file handle if mapping it failed.
        ::CloseHandle(file_mapping_handle);
        error = detail::last_error();
        return {};
    }
#else // POSIX
    char* mapping_start = static_cast<char*>(::mmap(
            0, // Don't give hint as to where to map.
            length_to_map,
            mode == access_mode::read ? PROT_READ : PROT_WRITE,
            MAP_SHARED,
            file_handle,
            aligned_offset));
    if(mapping_start == MAP_FAILED)
    {
        error = detail::last_error();
        return {};
    }
#endif
    mmap_context ctx;
    ctx.data = mapping_start + offset - aligned_offset;
    ctx.length = length;
    ctx.mapped_length = length_to_map;
#ifdef _WIN32
    ctx.file_mapping_handle = file_mapping_handle;
#endif
    return ctx;
}